

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

void __thiscall
lodepng::ExtractZlib::inflateHuffmanBlock
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength,unsigned_long btype)

{
  byte bVar1;
  iterator iVar2;
  iterator __position;
  unsigned_long uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int local_a4;
  size_t *local_a0;
  ulong *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_68;
  long local_60;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  HuffmanTree *local_40;
  HuffmanTree *local_38;
  
  if (btype == 2) {
    getTreeInflateDynamic(this,&this->codetree,&this->codetreeD,in,bp,inlength);
    if (this->error != 0) {
      return;
    }
  }
  else if (btype == 1) {
    generateFixedTrees(this,&this->codetree,&this->codetreeD);
  }
  local_38 = &this->codetree;
  local_40 = &this->codetreeD;
  local_78 = 0;
  local_70 = 0;
  local_a0 = bp;
  local_68 = (vector<unsigned_char,std::allocator<unsigned_char>> *)out;
  do {
    uVar3 = huffmanDecodeSymbol(this,in,local_a0,local_38,inlength);
    if (this->error != 0) goto LAB_0011fecc;
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = (int)uVar3;
    iVar2._M_current = *(int **)(lVar10 + -0x98);
    if (iVar2._M_current == *(int **)(lVar10 + -0x90)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0xa0),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = local_a4;
      *(int **)(lVar10 + -0x98) = iVar2._M_current + 1;
    }
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = 0;
    iVar2._M_current = *(int **)(lVar10 + -0x80);
    if (iVar2._M_current == *(int **)(lVar10 + -0x78)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0x88),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = 0;
      *(int **)(lVar10 + -0x80) = iVar2._M_current + 1;
    }
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = 0;
    iVar2._M_current = *(int **)(lVar10 + -0x68);
    if (iVar2._M_current == *(int **)(lVar10 + -0x60)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0x70),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = 0;
      *(int **)(lVar10 + -0x68) = iVar2._M_current + 1;
    }
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = 0;
    iVar2._M_current = *(int **)(lVar10 + -0x50);
    if (iVar2._M_current == *(int **)(lVar10 + -0x48)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0x58),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = 0;
      *(int **)(lVar10 + -0x50) = iVar2._M_current + 1;
    }
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = 0;
    iVar2._M_current = *(int **)(lVar10 + -0x38);
    if (iVar2._M_current == *(int **)(lVar10 + -0x30)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0x40),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = 0;
      *(int **)(lVar10 + -0x38) = iVar2._M_current + 1;
    }
    lVar10 = *(long *)(this->zlibinfo + 8);
    local_a4 = 0;
    iVar2._M_current = *(int **)(lVar10 + -0x20);
    if (iVar2._M_current == *(int **)(lVar10 + -0x18)) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)(lVar10 + -0x28),iVar2,&local_a4);
    }
    else {
      *iVar2._M_current = 0;
      *(int **)(lVar10 + -0x20) = iVar2._M_current + 1;
    }
    iVar11 = 2;
    if (uVar3 != 0x100) {
      if (uVar3 < 0x100) {
        local_a4 = CONCAT31(local_a4._1_3_,(char)uVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                   (uchar *)&local_a4);
        *pos = *pos + 1;
        local_70 = local_70 + 1;
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        if (uVar3 < 0x11e) {
          uVar5 = *local_a0;
          if (uVar5 >> 3 < inlength) {
            local_80 = *(long *)(
                                "color conversion to palette requested while a color isn\'t in palette, or index out of bounds"
                                + uVar3 * 8 + 0xb);
            local_98 = *(ulong **)
                        ("no null termination char found while decoding text chunk" +
                        uVar3 * 8 + 0x2b);
            if (uVar3 - 0x11d < 0xffffffffffffffec) {
              lVar6 = 0;
            }
            else {
              lVar10 = 0;
              lVar6 = 0;
              do {
                bVar1 = in[uVar5 + lVar10 >> 3];
                *local_a0 = uVar5 + 1 + lVar10;
                lVar6 = lVar6 + ((ulong)((bVar1 >> ((uint)(uVar5 + lVar10) & 7) & 1) != 0) <<
                                ((byte)lVar10 & 0x3f));
                lVar10 = lVar10 + 1;
              } while (local_80 != lVar10);
            }
            uVar3 = huffmanDecodeSymbol(this,in,local_a0,local_40,inlength);
            if (this->error == 0) {
              if (uVar3 < 0x1e) {
                uVar5 = *local_a0;
                if (uVar5 >> 3 < inlength) {
                  local_88 = *(long *)(DISTEXTRA + uVar3 * 8);
                  lVar10 = *(long *)(DISTBASE + uVar3 * 8);
                  if (uVar3 < 4) {
                    local_60 = 0;
                  }
                  else {
                    lVar4 = 0;
                    local_60 = 0;
                    do {
                      bVar1 = in[uVar5 + lVar4 >> 3];
                      *local_a0 = uVar5 + 1 + lVar4;
                      local_60 = local_60 +
                                 ((ulong)((bVar1 >> ((uint)(uVar5 + lVar4) & 7) & 1) != 0) <<
                                 ((byte)lVar4 & 0x3f));
                      lVar4 = lVar4 + 1;
                    } while (local_88 != lVar4);
                  }
                  local_60 = local_60 + lVar10;
                  uVar5 = *pos;
                  uVar8 = uVar5 - local_60;
                  uVar7 = (undefined4)local_80;
                  lVar6 = lVar6 + (long)local_98;
                  local_90 = uVar5;
                  uVar9 = uVar8;
                  local_48 = uVar8;
                  local_58 = uVar3;
                  lVar4 = local_80;
                  for (lVar10 = lVar6; local_98 = pos, local_50 = inlength, lVar10 != 0;
                      lVar10 = lVar10 + -1) {
                    __position._M_current = *(uchar **)(local_68 + 8);
                    if (__position._M_current == *(uchar **)(local_68 + 0x10)) {
                      std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      _M_realloc_insert<unsigned_char_const&>
                                (local_68,__position,(uchar *)(*(long *)local_68 + uVar9));
                      uVar5 = local_90;
                      lVar4 = local_80;
                      uVar8 = local_48;
                    }
                    else {
                      *__position._M_current = *(uchar *)(*(long *)local_68 + uVar9);
                      *(long *)(local_68 + 8) = *(long *)(local_68 + 8) + 1;
                    }
                    uVar7 = (undefined4)lVar4;
                    uVar9 = uVar9 + 1;
                    *local_98 = *local_98 + 1;
                    if (uVar5 <= uVar9) {
                      uVar9 = uVar8;
                    }
                    pos = local_98;
                    inlength = local_50;
                  }
                  local_78 = local_78 + 1;
                  lVar10 = *(long *)(this->zlibinfo + 8);
                  *(int *)(*(long *)(lVar10 + -0x80) + -4) = (int)local_58;
                  *(undefined4 *)(*(long *)(lVar10 + -0x68) + -4) = uVar7;
                  *(int *)(*(long *)(lVar10 + -0x50) + -4) = (int)local_88;
                  *(int *)(*(long *)(lVar10 + -0x38) + -4) = (int)lVar6;
                  *(int *)(*(long *)(lVar10 + -0x20) + -4) = (int)local_60;
                  goto LAB_001202a7;
                }
                goto LAB_00120188;
              }
              this->error = 0x12;
            }
          }
          else {
LAB_00120188:
            this->error = 0x33;
          }
LAB_0011fecc:
          iVar11 = 1;
        }
      }
    }
LAB_001202a7:
    if (iVar11 != 0) {
      if (iVar11 == 2) {
        lVar10 = *(long *)(this->zlibinfo + 8);
        *(long *)(lVar10 + -0x10) = local_70;
        *(long *)(lVar10 + -8) = local_78;
      }
      return;
    }
  } while( true );
}

Assistant:

void inflateHuffmanBlock(std::vector<unsigned char>& out,
                           const unsigned char* in, size_t& bp, size_t& pos, size_t inlength, unsigned long btype) {
    size_t numcodes = 0, numlit = 0, numlen = 0; //for logging
    if(btype == 1) { generateFixedTrees(codetree, codetreeD); }
    else if(btype == 2) { getTreeInflateDynamic(codetree, codetreeD, in, bp, inlength); if(error) return; }
    for(;;) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codetree, inlength); if(error) return;
      numcodes++;
      zlibinfo->back().lz77_lcode.push_back(code); //output code
      zlibinfo->back().lz77_dcode.push_back(0);
      zlibinfo->back().lz77_lbits.push_back(0);
      zlibinfo->back().lz77_dbits.push_back(0);
      zlibinfo->back().lz77_lvalue.push_back(0);
      zlibinfo->back().lz77_dvalue.push_back(0);

      if(code == 256) {
        break; //end code
      } else if(code <= 255) { //literal symbol
        out.push_back((unsigned char)(code));
        pos++;
        numlit++;
      } else if(code >= 257 && code <= 285) { //length code
        size_t length = LENBASE[code - 257], numextrabits = LENEXTRA[code - 257];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        length += readBitsFromStream(bp, in, numextrabits);
        unsigned long codeD = huffmanDecodeSymbol(in, bp, codetreeD, inlength); if(error) return;
        if(codeD > 29) { error = 18; return; } //error: invalid dist code (30-31 are never used)
        unsigned long dist = DISTBASE[codeD], numextrabitsD = DISTEXTRA[codeD];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        dist += readBitsFromStream(bp, in, numextrabitsD);
        size_t start = pos, back = start - dist; //backwards
        for(size_t i = 0; i < length; i++) {
          out.push_back(out[back++]);
          pos++;
          if(back >= start) back = start - dist;
        }
        numlen++;
        zlibinfo->back().lz77_dcode.back() = codeD; //output distance code
        zlibinfo->back().lz77_lbits.back() = numextrabits; //output length extra bits
        zlibinfo->back().lz77_dbits.back() = numextrabitsD; //output dist extra bits
        zlibinfo->back().lz77_lvalue.back() = length; //output length
        zlibinfo->back().lz77_dvalue.back() = dist; //output dist
      }
    }
    zlibinfo->back().numlit = numlit; //output number of literal symbols
    zlibinfo->back().numlen = numlen; //output number of length symbols
  }